

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetNetworkName
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aNetworkName)

{
  uint uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  anon_class_1_0_00000001 local_242;
  v10 local_241;
  v10 *local_240;
  size_t local_238;
  string local_230;
  Error local_210;
  anon_class_1_0_00000001 local_1e2;
  v10 local_1e1;
  v10 *local_1e0;
  size_t local_1d8;
  string local_1d0;
  Error local_1b0;
  undefined1 local_171;
  string *local_170;
  string *aNetworkName_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  Error **local_58;
  undefined1 *local_50;
  Error **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_40;
  Error **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_171 = 0;
  local_170 = aNetworkName;
  aNetworkName_local = (string *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar1 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar1 & 1) == 0) {
    GetNetworkName::anon_class_1_0_00000001::operator()(&local_1e2);
    local_b8 = &local_1e0;
    local_c0 = &local_1e1;
    bVar2 = ::fmt::v10::operator()(local_c0);
    local_1d8 = bVar2.size_;
    local_1e0 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_1d0;
    local_d8 = local_1e0;
    sStack_d0 = local_1d8;
    local_a0 = &local_d8;
    local_e8 = local_1e0;
    local_e0 = local_1d8;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    local_40 = local_68;
    local_20 = local_68;
    local_10 = local_60;
    ::fmt::v10::vformat_abi_cxx11_(&local_1d0,local_e8,fmt,args);
    Error::Error(&local_1b0,kInvalidState,&local_1d0);
    Error::operator=(__return_storage_ptr__,&local_1b0);
    Error::~Error(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  else if (((this->mActiveDataset).mPresentFlags & 0x200) == 0) {
    GetNetworkName::anon_class_1_0_00000001::operator()(&local_242);
    local_a8 = &local_240;
    local_b0 = &local_241;
    bVar2 = ::fmt::v10::operator()(local_b0);
    local_238 = bVar2.size_;
    local_240 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_110 = &local_230;
    local_120 = local_240;
    sStack_118 = local_238;
    local_80 = &local_120;
    local_130 = local_240;
    local_128 = local_238;
    local_78 = local_130;
    sStack_70 = local_128;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_50 = local_140;
    local_58 = &error;
    local_30 = 0;
    fmt_00.size_ = 0;
    fmt_00.data_ = (char *)local_128;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_58;
    local_48 = local_58;
    local_38 = local_58;
    local_28 = local_50;
    ::fmt::v10::vformat_abi_cxx11_(&local_230,local_130,fmt_00,args_00);
    Error::Error(&local_210,kNotFound,&local_230);
    Error::operator=(__return_storage_ptr__,&local_210);
    Error::~Error(&local_210);
    std::__cxx11::string::~string((string *)&local_230);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)local_170,(string *)&(this->mActiveDataset).mNetworkName);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetNetworkName(std::string &aNetworkName) const
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrExit(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kNetworkNameBit,
                 error = ERROR_NOT_FOUND("cannot find valid Network Name in Active Operational Dataset"));
    aNetworkName = mActiveDataset.mNetworkName;

exit:
    return error;
}